

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::ServiceDescriptorProto::ByteSizeLong(ServiceDescriptorProto *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  MethodDescriptorProto *value;
  size_t sVar4;
  string *value_00;
  uint local_40;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  ServiceDescriptorProto *this_local;
  
  _i = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ServiceDescriptorProto::unknown_fields(this);
    _i = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = method_size(this);
  _i = uVar2 + _i;
  for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
    value = method(this,local_40);
    sVar4 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::MethodDescriptorProto>
                      (value);
    _i = sVar4 + _i;
  }
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      value_00 = name_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(value_00);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_options(this);
    if (bVar1) {
      sVar4 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::ServiceOptions>
                        (this->options_);
      _i = sVar4 + 1 + _i;
    }
  }
  iVar3 = internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t ServiceDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceDescriptorProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  {
    unsigned int count = this->method_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->method(i));
    }
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.ServiceOptions options = 3;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->options_);
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}